

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

string * __thiscall
CMU462::Application::info_abi_cxx11_(string *__return_storage_ptr__,Application *this)

{
  code *pcVar1;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  Application *local_18;
  Application *this_local;
  
  local_18 = this;
  this_local = (Application *)__return_storage_ptr__;
  switch(*(undefined4 *)&(this->super_Renderer).field_0xc) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MeshEdit",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case 1:
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"PathTracer",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Animation",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return __return_storage_ptr__;
}

Assistant:

string Application::info() {
  switch (mode) {
    case MODEL_MODE:
      return "MeshEdit";
      break;
    case ANIMATE_MODE:
      return "Animation";
      break;
    case RENDER_MODE:
    case VISUALIZE_MODE:
      return "PathTracer";
      break;
  }
}